

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

ssize_t __thiscall TCPSocket::send(TCPSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  NoRemote *this_00;
  ulong uVar1;
  int *piVar2;
  IOError *this_01;
  ConnectionClosed *this_02;
  undefined4 in_register_00000034;
  allocator local_59;
  string local_58 [36];
  int local_34;
  int local_30;
  int x;
  int sent;
  int local_1c;
  void *pvStack_18;
  int size_local;
  char *buffer_local;
  TCPSocket *this_local;
  
  pvStack_18 = (void *)CONCAT44(in_register_00000034,__fd);
  local_1c = (int)__buf;
  buffer_local = (char *)this;
  if ((this->hasRemote & 1U) == 0) {
    this_00 = (NoRemote *)__cxa_allocate_exception(0x30);
    NoRemote::NoRemote(this_00);
    __cxa_throw(this_00,&NoRemote::typeinfo,NoRemote::~NoRemote);
  }
  uVar1 = write((this->super_Socket).socketDescriptor,pvStack_18,(long)local_1c);
  local_30 = (int)uVar1;
  if (local_30 < 0) {
    piVar2 = __errno_location();
    local_34 = *piVar2;
    this_01 = (IOError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58," - could not send",&local_59);
    IOError::IOError(this_01,(string *)local_58,local_34);
    __cxa_throw(this_01,&IOError::typeinfo,IOError::~IOError);
  }
  if (local_30 == 0) {
    this_02 = (ConnectionClosed *)__cxa_allocate_exception(0x30);
    ConnectionClosed::ConnectionClosed(this_02);
    __cxa_throw(this_02,&ConnectionClosed::typeinfo,ConnectionClosed::~ConnectionClosed);
  }
  return uVar1 & 0xffffffff;
}

Assistant:

int TCPSocket::send(const char *buffer, int size)
{
    if(!hasRemote)
    {
        throw NoRemote();
    }

    int sent = ::write(socketDescriptor, buffer, size);
    if(sent < 0){
        int x = errno;
        throw IOError(" - could not send", x);
    }
    else if(sent == 0){
        throw ConnectionClosed();
    }

    return sent;
}